

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O1

void __thiscall helics::Publication::publishString(Publication *this,string_view val)

{
  ValueFederate *pVVar1;
  bool bVar2;
  SmallBuffer db;
  undefined1 local_b0 [64];
  size_t local_70;
  byte *local_60;
  bool local_58;
  bool local_56;
  data_view local_50;
  
  pVVar1 = this->fed;
  if (this->changeDetectionEnabled == true) {
    bVar2 = changeDetected(&this->prevValue,val,this->delta);
    if (!bVar2) {
      return;
    }
    local_b0._0_8_ = local_b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b0,val._M_str,val._M_str + val._M_len);
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)&this->prevValue,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
    if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
  }
  if (pVVar1 != (ValueFederate *)0x0) {
    typeConvert((SmallBuffer *)local_b0,this->pubType,val);
    local_50.dblock._M_len = local_70;
    local_50.dblock._M_str = (char *)local_60;
    local_50.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_50.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    helics::ValueFederate::publishBytes(this->fed,this,&local_50);
    if (local_50.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.ref.
                 super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (((local_56 == true) && (local_58 == false)) && (local_60 != (byte *)0x0)) {
      operator_delete__(local_60);
    }
  }
  return;
}

Assistant:

void Publication::publishString(std::string_view val)
{
    bool doPublish = (fed != nullptr);
    if (changeDetectionEnabled) {
        if (changeDetected(prevValue, val, delta)) {
            prevValue = std::string(val);
        } else {
            doPublish = false;
        }
    }
    if (doPublish) {
        auto db = typeConvert(pubType, val);
        fed->publishBytes(*this, db);
    }
}